

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xml.cpp
# Opt level: O0

bool __thiscall Xml::Parser::load(Parser *this,String *filePath,Element *element)

{
  Private *this_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  char *data_00;
  String local_c0;
  undefined1 local_98 [8];
  String data;
  String local_68;
  File local_30;
  File file;
  Element *element_local;
  String *filePath_local;
  Parser *this_local;
  
  file.fp = element;
  File::File(&local_30);
  uVar2 = File::open(&local_30,(char *)filePath,1);
  if ((uVar2 & 1) == 0) {
    uVar3 = Error::getLastError();
    Error::getErrorString(&local_68,uVar3);
    String::operator=(&(this->p->super_Private).errorString,&local_68);
    this_local._7_1_ = false;
    String::~String(&local_68);
    data._data.ref._4_4_ = 1;
  }
  else {
    String::String((String *)local_98);
    bVar1 = File::readAll(&local_30,(String *)local_98);
    if (bVar1) {
      this_00 = &this->p->super_Private;
      data_00 = String::operator_cast_to_char_((String *)local_98);
      this_local._7_1_ = Xml::Private::parse(this_00,data_00,(Element *)file.fp);
    }
    else {
      uVar3 = Error::getLastError();
      Error::getErrorString(&local_c0,uVar3);
      String::operator=(&(this->p->super_Private).errorString,&local_c0);
      this_local._7_1_ = false;
      String::~String(&local_c0);
    }
    data._data.ref._4_4_ = 1;
    String::~String((String *)local_98);
  }
  File::~File(&local_30);
  return this_local._7_1_;
}

Assistant:

bool Xml::Parser::load(const String& filePath, Element& element)
{
  File file;
  if(!file.open(filePath))
    return p->errorString = Error::getErrorString(), false;
  String data;
  if(!file.readAll(data))
    return p->errorString = Error::getErrorString(), false;
  return p->parse(data, element);
}